

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logging.cpp
# Opt level: O2

void __thiscall
sznet::Logger::Logger(Logger *this,SourceFile file,int line,LogLevel level,char *func)

{
  char *pcVar1;
  self *psVar2;
  char **ppcVar3;
  undefined1 local_28 [8];
  SourceFile file_local;
  
  local_28 = (undefined1  [8])file.m_data;
  file_local.m_data._0_4_ = file.m_size;
  Impl::Impl(&this->m_impl,level,0,(SourceFile *)local_28,line);
  psVar2 = LogStream::operator<<(&(this->m_impl).m_stream,func);
  pcVar1 = (psVar2->m_buffer).m_cur;
  ppcVar3 = &(psVar2->m_buffer).m_cur;
  if (((int)ppcVar3 - (int)pcVar1 & 0xfffffffeU) != 0) {
    *pcVar1 = ' ';
    *ppcVar3 = *ppcVar3 + 1;
  }
  return;
}

Assistant:

Logger::Logger(SourceFile file, int line, LogLevel level, const char* func): 
	m_impl(level, 0, file, line)
{
	m_impl.m_stream << func << ' ';
}